

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void update_live(MIR_reg_t var,int out_p,bitmap_t live)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int in_ECX;
  int iVar7;
  int extraout_EDX;
  uint uVar8;
  size_t sVar9;
  undefined4 in_register_0000003c;
  bitmap_t pVVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  
  pVVar10 = (bitmap_t)CONCAT44(in_register_0000003c,var);
  uVar6 = (ulong)var;
  if (out_p == 0) {
    sVar9 = uVar6 + 1;
    pVVar10 = live;
    bitmap_expand(live,sVar9);
    out_p = (int)sVar9;
    if (live == (bitmap_t)0x0) goto LAB_001702f4;
    live->varr[var >> 6] = live->varr[var >> 6] | 1L << (uVar6 & 0x3f);
  }
  else {
    if (live == (bitmap_t)0x0) {
      update_live_cold_1();
LAB_001702f4:
      update_live_cold_2();
      sVar9 = pVVar10[0xf].els_num;
      lVar12 = 0x1e8;
      uVar6 = (ulong)(in_ECX != 0);
      if (in_ECX == 0) {
        lVar12 = 0x188;
      }
      iVar2 = *(int *)(sVar9 + 0x180 + uVar6 * 4);
      lVar11 = (long)iVar2;
      lVar1 = sVar9 + lVar12;
      if (lVar11 < 1) {
        uVar14 = 0;
      }
      else {
        lVar12 = lVar12 + 8 + sVar9;
        uVar8 = extraout_EDX - 8;
        lVar13 = 0;
        uVar14 = 0;
        do {
          if ((out_p != -1) && (*(int *)(lVar12 + -4 + lVar13) == out_p)) {
            return;
          }
          iVar5 = *(int *)(lVar12 + lVar13);
          if (uVar14 == 0) {
            iVar7 = 10;
            if (uVar8 < 3) {
              iVar7 = *(int *)(&DAT_001b1a90 + (ulong)uVar8 * 4);
            }
            uVar4 = 1;
            if (iVar5 != iVar7) goto LAB_00170398;
          }
          else {
LAB_00170398:
            iVar7 = 0xb;
            if (uVar8 < 3) {
              iVar7 = *(int *)(&DAT_001b1a9c + (ulong)uVar8 * 4);
            }
            uVar4 = uVar14;
            if (iVar5 == iVar7) {
              uVar4 = 2;
            }
          }
          uVar14 = uVar4;
          lVar13 = lVar13 + 0xc;
        } while (lVar11 * 0xc != lVar13);
        if (1 < uVar14) {
          __assert_fail("rld_num <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
      }
      if (extraout_EDX == 10) {
        iVar5 = -1;
      }
      else {
        if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
          iVar5 = 0x19;
        }
        else {
          iVar5 = 0xb;
        }
        iVar5 = iVar5 - (uint)(uVar14 == 0);
      }
      *(int *)(sVar9 + uVar6 * 4 + 0x180) = iVar2 + 1;
      if (iVar2 < 8) {
        *(int *)(lVar1 + 4 + lVar11 * 0xc) = out_p;
        *(int *)(lVar1 + lVar11 * 0xc) = extraout_EDX;
        *(int *)(lVar1 + 8 + lVar11 * 0xc) = iVar5;
        return;
      }
      __assert_fail("rld_num < (2 * 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    if (uVar6 < live->els_num << 6) {
      bVar3 = (byte)var & 0x3f;
      live->varr[var >> 6] =
           live->varr[var >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    }
  }
  return;
}

Assistant:

static void update_live (MIR_reg_t var, int out_p, bitmap_t live) {
  if (out_p) {
    bitmap_clear_bit_p (live, var);
  } else {
    bitmap_set_bit_p (live, var);
  }
}